

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,true,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong idx;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  idx_t i;
  ulong idx_00;
  idx_t idx_01;
  ulong uVar6;
  ulong uVar7;
  uhugeint_t uVar8;
  uhugeint_t right;
  uhugeint_t right_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar4 = 8;
    for (idx_01 = 0; count != idx_01; idx_01 = idx_01 + 1) {
      uVar8.upper = *(uint64_t *)((long)&rdata->lower + lVar4);
      uVar8.lower = *(uint64_t *)((long)rdata + lVar4 + -8);
      uVar8 = BinaryZeroIsNullWrapper::
              Operation<bool,duckdb::DivideOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                        (fun,*ldata,uVar8,mask,idx_01);
      *(uint64_t *)((long)result_data + lVar4 + -8) = uVar8.lower;
      *(uint64_t *)((long)&result_data->lower + lVar4) = uVar8.upper;
      lVar4 = lVar4 + 0x10;
    }
  }
  else {
    idx_00 = 0;
    for (uVar2 = 0; uVar2 != count + 0x3f >> 6; uVar2 = uVar2 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar3 = idx_00 + 0x40;
        if (count <= idx_00 + 0x40) {
          uVar3 = count;
        }
LAB_0080ce14:
        uVar6 = idx_00 << 4 | 8;
        for (; idx = idx_00, idx_00 < uVar3; idx_00 = idx_00 + 1) {
          right.upper = *(uint64_t *)((long)&rdata->lower + uVar6);
          right.lower = *(uint64_t *)((long)rdata + (uVar6 - 8));
          uVar8 = BinaryZeroIsNullWrapper::
                  Operation<bool,duckdb::DivideOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                            (fun,*ldata,right,mask,idx_00);
          *(uint64_t *)((long)result_data + (uVar6 - 8)) = uVar8.lower;
          *(uint64_t *)((long)&result_data->lower + uVar6) = uVar8.upper;
          uVar6 = uVar6 + 0x10;
        }
      }
      else {
        uVar6 = puVar1[uVar2];
        uVar3 = idx_00 + 0x40;
        if (count <= idx_00 + 0x40) {
          uVar3 = count;
        }
        if (uVar6 == 0xffffffffffffffff) goto LAB_0080ce14;
        idx = uVar3;
        if (uVar6 != 0) {
          uVar5 = idx_00 << 4 | 8;
          for (uVar7 = 0; idx = idx_00 + uVar7, idx < uVar3; uVar7 = uVar7 + 1) {
            if ((uVar6 >> (uVar7 & 0x3f) & 1) != 0) {
              right_00.upper = *(uint64_t *)((long)&rdata->lower + uVar5);
              right_00.lower = *(uint64_t *)((long)rdata + (uVar5 - 8));
              uVar8 = BinaryZeroIsNullWrapper::
                      Operation<bool,duckdb::DivideOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                                (fun,*ldata,right_00,mask,idx);
              *(uint64_t *)((long)result_data + (uVar5 - 8)) = uVar8.lower;
              *(uint64_t *)((long)&result_data->lower + uVar5) = uVar8.upper;
            }
            uVar5 = uVar5 + 0x10;
          }
        }
      }
      idx_00 = idx;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}